

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int i_2;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  uint uVar17;
  long lVar18;
  int q_1;
  uint uVar19;
  int q;
  bool bVar20;
  float fVar21;
  float in_XMM1_Da;
  float local_b4;
  Mat mins;
  Mat local_68;
  void *local_38;
  
  iVar6 = this->operation;
  switch(iVar6) {
  case 0:
    iVar6 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da);
    return iVar6;
  case 1:
    iVar6 = this->dim;
    local_b4 = this->coeff;
    uVar14 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar17 = bottom_blob->c;
    uVar9 = (ulong)uVar17;
    if (iVar6 == 0) {
      uVar19 = 1;
      goto LAB_00111540;
    }
    switch(iVar6) {
    default:
      goto switchD_0011135e_caseD_0;
    case 1:
      uVar19 = uVar17;
LAB_00111540:
      Mat::create(top_blob,uVar19,4);
      goto switchD_0011135e_caseD_0;
    case 2:
      uVar19 = uVar2;
      uVar11 = uVar17;
      break;
    case -2:
      uVar19 = uVar14;
      uVar11 = uVar2;
      break;
    case -1:
      uVar19 = uVar14;
      goto LAB_00111540;
    }
    Mat::create(top_blob,uVar19,uVar11,4);
switchD_0011135e_caseD_0:
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar19 = uVar2 * uVar14;
    if (iVar6 == 0) {
      Mat::Mat(&mins,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      uVar15 = 0;
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)pvVar16 + uVar7 * 4));
        }
        *(float *)((long)mins.data + uVar15 * 4) = fVar21;
      }
      fVar21 = 0.0;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        fVar21 = fVar21 + *(float *)((long)mins.data + uVar12 * 4);
      }
      goto LAB_0011243a;
    }
    switch(iVar6) {
    case 0:
      goto switchD_001122c8_caseD_0;
    case 1:
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar9 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar15);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)pvVar16 + uVar7 * 4));
        }
        *(float *)((long)top_blob->data + uVar15 * 4) = fVar21 * local_b4;
      }
      break;
    case 2:
      uVar19 = 0;
      if (0 < (int)uVar14) {
        uVar19 = uVar14;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
        Mat::channel(&mins,bottom_blob,uVar11);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        Mat::channel(&mins,top_blob,uVar11);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
          fVar21 = 0.0;
          uVar10 = uVar19;
          while (bVar20 = uVar10 != 0, uVar10 = uVar10 - 1, bVar20) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar16 + uVar9 * 4));
          }
          *(float *)((long)pvVar3 + uVar9 * 4) = fVar21 * local_b4;
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(top_blob,0.0);
      uVar14 = 0;
      if ((int)uVar19 < 1) {
        uVar19 = uVar14;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        pvVar16 = top_blob->data;
        for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar16 + uVar9 * 4) =
               ABS(*(float *)((long)pvVar3 + uVar9 * 4)) + *(float *)((long)pvVar16 + uVar9 * 4);
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      return 0;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      Mat::fill(&mins,0.0);
      uVar15 = 0;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        lVar18 = sVar5 * sVar4 * uVar15;
        for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)local_38 + uVar13 * 4 + lVar18) =
                 ABS(*(float *)((long)pvVar16 + uVar8 * 4)) +
                 *(float *)((long)local_38 + uVar13 * 4 + lVar18);
          }
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,0.0);
      for (uVar15 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar16 = mins.data,
          uVar15 != uVar9; uVar15 = uVar15 + 1) {
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        pvVar3 = top_blob->data;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar3 + uVar7 * 4) =
               *(float *)((long)pvVar16 + uVar7 * 4 + sVar5 * sVar4 * uVar15) +
               *(float *)((long)pvVar3 + uVar7 * 4);
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      goto LAB_00112448;
    }
    goto switchD_001122c8_default;
  case 2:
    iVar6 = this->dim;
    local_b4 = this->coeff;
    uVar14 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar17 = bottom_blob->c;
    uVar9 = (ulong)uVar17;
    if (iVar6 == 0) {
      uVar19 = 1;
      goto LAB_001113ba;
    }
    switch(iVar6) {
    default:
      goto switchD_00111264_caseD_0;
    case 1:
      uVar19 = uVar17;
LAB_001113ba:
      Mat::create(top_blob,uVar19,4);
      goto switchD_00111264_caseD_0;
    case 2:
      uVar19 = uVar2;
      uVar11 = uVar17;
      break;
    case -2:
      uVar19 = uVar14;
      uVar11 = uVar2;
      break;
    case -1:
      uVar19 = uVar14;
      goto LAB_001113ba;
    }
    Mat::create(top_blob,uVar19,uVar11,4);
switchD_00111264_caseD_0:
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar19 = uVar2 * uVar14;
    if (iVar6 == 0) {
      Mat::Mat(&mins,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      uVar15 = 0;
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar16 + uVar7 * 4);
          fVar21 = fVar21 + fVar1 * fVar1;
        }
        *(float *)((long)mins.data + uVar15 * 4) = fVar21;
      }
      fVar21 = 0.0;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        fVar21 = fVar21 + *(float *)((long)mins.data + uVar12 * 4);
      }
      goto LAB_0011243a;
    }
    switch(iVar6) {
    case 0:
      goto switchD_001122c8_caseD_0;
    case 1:
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar9 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar15);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar16 + uVar7 * 4);
          fVar21 = fVar21 + fVar1 * fVar1;
        }
        *(float *)((long)top_blob->data + uVar15 * 4) = fVar21 * local_b4;
      }
      break;
    case 2:
      uVar19 = 0;
      if (0 < (int)uVar14) {
        uVar19 = uVar14;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
        Mat::channel(&mins,bottom_blob,uVar11);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        Mat::channel(&mins,top_blob,uVar11);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
          fVar21 = 0.0;
          uVar10 = uVar19;
          while (bVar20 = uVar10 != 0, uVar10 = uVar10 - 1, bVar20) {
            fVar1 = *(float *)((long)pvVar16 + uVar9 * 4);
            fVar21 = fVar21 + fVar1 * fVar1;
          }
          *(float *)((long)pvVar3 + uVar9 * 4) = fVar21 * local_b4;
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(top_blob,0.0);
      uVar14 = 0;
      if ((int)uVar19 < 1) {
        uVar19 = uVar14;
      }
      if ((int)uVar17 < 1) {
        uVar17 = uVar14;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        pvVar16 = top_blob->data;
        for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
          fVar21 = *(float *)((long)pvVar3 + uVar9 * 4);
          *(float *)((long)pvVar16 + uVar9 * 4) =
               fVar21 * fVar21 + *(float *)((long)pvVar16 + uVar9 * 4);
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      return 0;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      Mat::fill(&mins,0.0);
      uVar15 = 0;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        lVar18 = sVar5 * sVar4 * uVar15;
        for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            fVar21 = *(float *)((long)pvVar16 + uVar8 * 4);
            *(float *)((long)local_38 + uVar13 * 4 + lVar18) =
                 fVar21 * fVar21 + *(float *)((long)local_38 + uVar13 * 4 + lVar18);
          }
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,0.0);
      for (uVar15 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar16 = mins.data,
          uVar15 != uVar9; uVar15 = uVar15 + 1) {
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        pvVar3 = top_blob->data;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar3 + uVar7 * 4) =
               *(float *)((long)pvVar16 + uVar7 * 4 + sVar5 * sVar4 * uVar15) +
               *(float *)((long)pvVar3 + uVar7 * 4);
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      goto LAB_00112448;
    }
    goto switchD_001122c8_default;
  case 3:
    iVar6 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da);
    if (iVar6 != 0) {
      return -100;
    }
    if (this->dim + 2U < 5) {
      uVar14 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar17 = bottom_blob->c;
      uVar19 = uVar2 * uVar14;
      switch(this->dim) {
      case 0:
        *(float *)top_blob->data = *top_blob->data / (float)(int)(uVar17 * uVar19);
        break;
      case 1:
        pvVar16 = top_blob->data;
        uVar12 = 0;
        uVar9 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar9 = uVar12;
        }
        for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          *(float *)((long)pvVar16 + uVar12 * 4) =
               *(float *)((long)pvVar16 + uVar12 * 4) * (1.0 / (float)(int)uVar19);
        }
        break;
      case 2:
        uVar19 = 0;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          Mat::channel(&mins,top_blob,uVar19);
          pvVar16 = mins.data;
          Mat::~Mat(&mins);
          for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar16 + uVar9 * 4) =
                 *(float *)((long)pvVar16 + uVar9 * 4) * (1.0 / (float)(int)uVar14);
          }
        }
        break;
      case -2:
        pvVar16 = top_blob->data;
        uVar12 = 0;
        uVar9 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar9 = uVar12;
        }
        for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          *(float *)((long)pvVar16 + uVar12 * 4) =
               *(float *)((long)pvVar16 + uVar12 * 4) * (1.0 / (float)(int)uVar17);
        }
        break;
      case -1:
        pvVar16 = top_blob->data;
        uVar12 = 0;
        uVar9 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar9 = uVar12;
        }
        for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          *(float *)((long)pvVar16 + uVar12 * 4) =
               *(float *)((long)pvVar16 + uVar12 * 4) * (1.0 / (float)(int)(uVar17 * uVar2));
        }
      }
    }
    iVar6 = this->operation;
  }
  if (iVar6 != 6) {
    if (iVar6 != 5) {
      if (iVar6 != 4) {
        return 0;
      }
      iVar6 = this->dim;
      local_b4 = this->coeff;
      uVar14 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar17 = bottom_blob->c;
      uVar9 = (ulong)uVar17;
      if (iVar6 == 0) {
        uVar19 = 1;
        goto LAB_001120ee;
      }
      switch(iVar6) {
      default:
        goto switchD_001117d4_caseD_0;
      case 1:
        uVar19 = uVar17;
LAB_001120ee:
        Mat::create(top_blob,uVar19,4);
        goto switchD_001117d4_caseD_0;
      case 2:
        uVar19 = uVar2;
        uVar11 = uVar17;
        break;
      case -2:
        uVar19 = uVar14;
        uVar11 = uVar2;
        break;
      case -1:
        uVar19 = uVar14;
        goto LAB_001120ee;
      }
      Mat::create(top_blob,uVar19,uVar11,4);
switchD_001117d4_caseD_0:
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      uVar19 = uVar2 * uVar14;
      if (iVar6 == 0) {
        Mat::Mat(&mins,uVar17,4);
        if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
        uVar15 = 0;
        uVar12 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar12 = uVar15;
        }
        if ((int)uVar17 < 1) {
          uVar9 = uVar15;
        }
        for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
          Mat::channel(&local_68,bottom_blob,(int)uVar15);
          pvVar16 = local_68.data;
          Mat::~Mat(&local_68);
          fVar21 = -3.4028235e+38;
          for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
            fVar1 = *(float *)((long)pvVar16 + uVar7 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
          }
          *(float *)((long)mins.data + uVar15 * 4) = fVar21;
        }
        fVar21 = -3.4028235e+38;
        for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          fVar1 = *(float *)((long)mins.data + uVar12 * 4);
          if (fVar21 <= fVar1) {
            fVar21 = fVar1;
          }
        }
        goto LAB_0011243a;
      }
      switch(iVar6) {
      case 0:
        return 0;
      case 1:
        uVar12 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar12 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar9 = 0;
        }
        for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
          Mat::channel(&mins,bottom_blob,(int)uVar15);
          pvVar16 = mins.data;
          Mat::~Mat(&mins);
          fVar21 = -3.4028235e+38;
          for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
            fVar1 = *(float *)((long)pvVar16 + uVar7 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
          }
          *(float *)((long)top_blob->data + uVar15 * 4) = fVar21 * local_b4;
        }
        break;
      case 2:
        uVar19 = 0;
        if (0 < (int)uVar14) {
          uVar19 = uVar14;
        }
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
          Mat::channel(&mins,bottom_blob,uVar11);
          pvVar16 = mins.data;
          Mat::~Mat(&mins);
          Mat::channel(&mins,top_blob,uVar11);
          pvVar3 = mins.data;
          Mat::~Mat(&mins);
          for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
            fVar21 = -3.4028235e+38;
            uVar10 = uVar19;
            while (bVar20 = uVar10 != 0, uVar10 = uVar10 - 1, bVar20) {
              fVar1 = *(float *)((long)pvVar16 + uVar9 * 4);
              if (fVar21 <= fVar1) {
                fVar21 = fVar1;
              }
            }
            *(float *)((long)pvVar3 + uVar9 * 4) = fVar21 * local_b4;
            pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
          }
        }
        return 0;
      case -2:
        Mat::fill(top_blob,-3.4028235e+38);
        uVar14 = 0;
        if ((int)uVar19 < 1) {
          uVar19 = uVar14;
        }
        if ((int)uVar17 < 1) {
          uVar17 = uVar14;
        }
        for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
          Mat::channel(&mins,bottom_blob,uVar14);
          pvVar3 = mins.data;
          Mat::~Mat(&mins);
          pvVar16 = top_blob->data;
          for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
            fVar21 = *(float *)((long)pvVar3 + uVar9 * 4);
            fVar1 = *(float *)((long)pvVar16 + uVar9 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
            *(float *)((long)pvVar16 + uVar9 * 4) = fVar21;
          }
        }
        pvVar16 = top_blob->data;
        for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
        }
        return 0;
      case -1:
        Mat::Mat(&mins,uVar14,1,uVar17,4);
        if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
        Mat::fill(&mins,-3.4028235e+38);
        uVar15 = 0;
        uVar12 = 0;
        if (0 < (int)uVar14) {
          uVar12 = (ulong)uVar14;
        }
        uVar7 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar7 = uVar15;
        }
        if ((int)uVar17 < 1) {
          uVar9 = uVar15;
        }
        for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
          Mat::channel(&local_68,bottom_blob,(int)uVar15);
          pvVar16 = local_68.data;
          Mat::~Mat(&local_68);
          sVar5 = mins.cstep;
          sVar4 = mins.elemsize;
          local_38 = mins.data;
          local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
          local_68.refcount = (int *)0x0;
          local_68.elemsize = mins.elemsize;
          local_68.dims = 2;
          local_68.w = mins.w;
          local_68.h = mins.h;
          local_68.c = 1;
          local_68.cstep = (size_t)(mins.h * mins.w);
          Mat::~Mat(&local_68);
          lVar18 = sVar5 * sVar4 * uVar15;
          for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
            for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
              fVar21 = *(float *)((long)pvVar16 + uVar8 * 4);
              fVar1 = *(float *)((long)local_38 + uVar13 * 4 + lVar18);
              if (fVar21 <= fVar1) {
                fVar21 = fVar1;
              }
              *(float *)((long)local_38 + uVar13 * 4 + lVar18) = fVar21;
            }
            pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
          }
        }
        Mat::fill(top_blob,-3.4028235e+38);
        for (uVar15 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar16 = mins.data,
            uVar15 != uVar9; uVar15 = uVar15 + 1) {
          local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
          local_68.refcount = (int *)0x0;
          local_68.elemsize = mins.elemsize;
          local_68.dims = 2;
          local_68.w = mins.w;
          local_68.h = mins.h;
          local_68.c = 1;
          local_68.cstep = (size_t)(mins.h * mins.w);
          Mat::~Mat(&local_68);
          pvVar3 = top_blob->data;
          for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
            fVar21 = *(float *)((long)pvVar16 + uVar7 * 4 + sVar5 * sVar4 * uVar15);
            fVar1 = *(float *)((long)pvVar3 + uVar7 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
            *(float *)((long)pvVar3 + uVar7 * 4) = fVar21;
          }
        }
        pvVar16 = top_blob->data;
        for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
        }
        goto LAB_00112448;
      }
      goto switchD_001122c8_default;
    }
    iVar6 = this->dim;
    local_b4 = this->coeff;
    uVar14 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar17 = bottom_blob->c;
    uVar9 = (ulong)uVar17;
    if (iVar6 == 0) {
      uVar19 = 1;
      goto LAB_00111f57;
    }
    switch(iVar6) {
    default:
      goto switchD_00111834_caseD_0;
    case 1:
      uVar19 = uVar17;
LAB_00111f57:
      Mat::create(top_blob,uVar19,4);
      goto switchD_00111834_caseD_0;
    case 2:
      uVar19 = uVar2;
      uVar11 = uVar17;
      break;
    case -2:
      uVar19 = uVar14;
      uVar11 = uVar2;
      break;
    case -1:
      uVar19 = uVar14;
      goto LAB_00111f57;
    }
    Mat::create(top_blob,uVar19,uVar11,4);
switchD_00111834_caseD_0:
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar19 = uVar2 * uVar14;
    if (iVar6 == 0) {
      Mat::Mat(&mins,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      uVar15 = 0;
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        fVar21 = 3.4028235e+38;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar16 + uVar7 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
        }
        *(float *)((long)mins.data + uVar15 * 4) = fVar21;
      }
      fVar21 = 3.4028235e+38;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        fVar1 = *(float *)((long)mins.data + uVar12 * 4);
        if (fVar1 <= fVar21) {
          fVar21 = fVar1;
        }
      }
      goto LAB_0011243a;
    }
    switch(iVar6) {
    case 0:
      return 0;
    case 1:
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar9 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar15);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 3.4028235e+38;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar16 + uVar7 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
        }
        *(float *)((long)top_blob->data + uVar15 * 4) = fVar21 * local_b4;
      }
      break;
    case 2:
      uVar19 = 0;
      if (0 < (int)uVar14) {
        uVar19 = uVar14;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
        Mat::channel(&mins,bottom_blob,uVar11);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        Mat::channel(&mins,top_blob,uVar11);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
          fVar21 = 3.4028235e+38;
          uVar10 = uVar19;
          while (bVar20 = uVar10 != 0, uVar10 = uVar10 - 1, bVar20) {
            fVar1 = *(float *)((long)pvVar16 + uVar9 * 4);
            if (fVar1 <= fVar21) {
              fVar21 = fVar1;
            }
          }
          *(float *)((long)pvVar3 + uVar9 * 4) = fVar21 * local_b4;
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      return 0;
    case -2:
      Mat::fill(top_blob,3.4028235e+38);
      uVar14 = 0;
      if ((int)uVar19 < 1) {
        uVar19 = uVar14;
      }
      if ((int)uVar17 < 1) {
        uVar17 = uVar14;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        pvVar16 = top_blob->data;
        for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
          fVar21 = *(float *)((long)pvVar3 + uVar9 * 4);
          fVar1 = *(float *)((long)pvVar16 + uVar9 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
          *(float *)((long)pvVar16 + uVar9 * 4) = fVar21;
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      return 0;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      Mat::fill(&mins,3.4028235e+38);
      uVar15 = 0;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        lVar18 = sVar5 * sVar4 * uVar15;
        for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            fVar21 = *(float *)((long)pvVar16 + uVar8 * 4);
            fVar1 = *(float *)((long)local_38 + uVar13 * 4 + lVar18);
            if (fVar1 <= fVar21) {
              fVar21 = fVar1;
            }
            *(float *)((long)local_38 + uVar13 * 4 + lVar18) = fVar21;
          }
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,3.4028235e+38);
      for (uVar15 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar16 = mins.data,
          uVar15 != uVar9; uVar15 = uVar15 + 1) {
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        pvVar3 = top_blob->data;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = *(float *)((long)pvVar16 + uVar7 * 4 + sVar5 * sVar4 * uVar15);
          fVar1 = *(float *)((long)pvVar3 + uVar7 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
          *(float *)((long)pvVar3 + uVar7 * 4) = fVar21;
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      goto LAB_00112448;
    }
    goto switchD_001122c8_default;
  }
  iVar6 = this->dim;
  local_b4 = this->coeff;
  uVar14 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar17 = bottom_blob->c;
  uVar9 = (ulong)uVar17;
  if (iVar6 == 0) {
    uVar19 = 1;
    goto LAB_00111f67;
  }
  switch(iVar6) {
  default:
    goto switchD_00111890_caseD_0;
  case 1:
    uVar19 = uVar17;
LAB_00111f67:
    Mat::create(top_blob,uVar19,4);
    goto switchD_00111890_caseD_0;
  case 2:
    uVar19 = uVar2;
    uVar11 = uVar17;
    break;
  case -2:
    uVar19 = uVar14;
    uVar11 = uVar2;
    break;
  case -1:
    uVar19 = uVar14;
    goto LAB_00111f67;
  }
  Mat::create(top_blob,uVar19,uVar11,4);
switchD_00111890_caseD_0:
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar19 = uVar2 * uVar14;
  if (iVar6 == 0) {
    Mat::Mat(&mins,uVar17,4);
    if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) {
LAB_00112ce1:
      Mat::~Mat(&mins);
      return -100;
    }
    uVar15 = 0;
    uVar12 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar12 = uVar15;
    }
    if ((int)uVar17 < 1) {
      uVar9 = uVar15;
    }
    for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
      Mat::channel(&local_68,bottom_blob,(int)uVar15);
      pvVar16 = local_68.data;
      Mat::~Mat(&local_68);
      fVar21 = 1.0;
      for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
        fVar21 = fVar21 * *(float *)((long)pvVar16 + uVar7 * 4);
      }
      *(float *)((long)mins.data + uVar15 * 4) = fVar21;
    }
    fVar21 = 1.0;
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      fVar21 = fVar21 * *(float *)((long)mins.data + uVar12 * 4);
    }
LAB_0011243a:
    *(float *)top_blob->data = fVar21 * local_b4;
LAB_00112448:
    Mat::~Mat(&mins);
  }
  else {
    switch(iVar6) {
    case 0:
      return 0;
    case 1:
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar9 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar15);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 1.0;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 * *(float *)((long)pvVar16 + uVar7 * 4);
        }
        *(float *)((long)top_blob->data + uVar15 * 4) = fVar21 * local_b4;
      }
      break;
    case 2:
      uVar19 = 0;
      if (0 < (int)uVar14) {
        uVar19 = uVar14;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
        Mat::channel(&mins,bottom_blob,uVar11);
        pvVar16 = mins.data;
        Mat::~Mat(&mins);
        Mat::channel(&mins,top_blob,uVar11);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
          fVar21 = 1.0;
          uVar10 = uVar19;
          while (bVar20 = uVar10 != 0, uVar10 = uVar10 - 1, bVar20) {
            fVar21 = fVar21 * *(float *)((long)pvVar16 + uVar9 * 4);
          }
          *(float *)((long)pvVar3 + uVar9 * 4) = fVar21 * local_b4;
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      return 0;
    case -2:
      Mat::fill(top_blob,1.0);
      uVar14 = 0;
      if ((int)uVar19 < 1) {
        uVar19 = uVar14;
      }
      if ((int)uVar17 < 1) {
        uVar17 = uVar14;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        pvVar16 = top_blob->data;
        for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar16 + uVar9 * 4) =
               *(float *)((long)pvVar3 + uVar9 * 4) * *(float *)((long)pvVar16 + uVar9 * 4);
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      return 0;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00112ce1;
      Mat::fill(&mins,1.0);
      uVar15 = 0;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar15;
      }
      if ((int)uVar17 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar15);
        pvVar16 = local_68.data;
        Mat::~Mat(&local_68);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        lVar18 = sVar5 * sVar4 * uVar15;
        for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)local_38 + uVar13 * 4 + lVar18) =
                 *(float *)((long)pvVar16 + uVar8 * 4) *
                 *(float *)((long)local_38 + uVar13 * 4 + lVar18);
          }
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,1.0);
      for (uVar15 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar16 = mins.data,
          uVar15 != uVar9; uVar15 = uVar15 + 1) {
        local_68.data = (void *)(mins.cstep * uVar15 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        pvVar3 = top_blob->data;
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar3 + uVar7 * 4) =
               *(float *)((long)pvVar16 + uVar7 * 4 + sVar5 * sVar4 * uVar15) *
               *(float *)((long)pvVar3 + uVar7 * 4);
        }
      }
      pvVar16 = top_blob->data;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar16 + uVar9 * 4) = *(float *)((long)pvVar16 + uVar9 * 4) * local_b4;
      }
      goto LAB_00112448;
    }
  }
switchD_001122c8_default:
switchD_001122c8_caseD_0:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff);

    return 0;
}